

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__horizontal_gather_7_channels_with_7_coeffs
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  undefined8 *puVar1;
  int *in_RCX;
  long in_RDX;
  int in_ESI;
  undefined8 *in_RDI;
  undefined8 *in_R8;
  int in_R9D;
  undefined8 *local_528;
  undefined8 *local_510;
  int *local_508;
  float fStack_3b0;
  float fStack_3a4;
  float local_398;
  float fStack_37c;
  float fStack_370;
  float fStack_364;
  float local_358;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  __m128 cs;
  __m128 c;
  __m128 tot3;
  __m128 tot2;
  __m128 tot1;
  __m128 tot0;
  float *hc;
  float *decode;
  float *output;
  float *output_end;
  
  local_528 = in_RDI;
  local_510 = in_R8;
  local_508 = in_RCX;
  do {
    puVar1 = (undefined8 *)(in_RDX + (long)(*local_508 * 7) * 4);
    local_358 = (float)*local_510;
    local_1a8 = (float)*puVar1;
    fStack_1a4 = (float)((ulong)*puVar1 >> 0x20);
    fStack_1a0 = (float)puVar1[1];
    fStack_19c = (float)((ulong)puVar1[1] >> 0x20);
    local_1c8 = (float)*(undefined8 *)((long)puVar1 + 0xc);
    fStack_1c4 = (float)((ulong)*(undefined8 *)((long)puVar1 + 0xc) >> 0x20);
    fStack_1c0 = (float)*(undefined8 *)((long)puVar1 + 0x14);
    fStack_1bc = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x14) >> 0x20);
    fStack_364 = (float)((ulong)*local_510 >> 0x20);
    local_1e8 = (float)*(undefined8 *)((long)puVar1 + 0x1c);
    fStack_1e4 = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x1c) >> 0x20);
    fStack_1e0 = (float)*(undefined8 *)((long)puVar1 + 0x24);
    fStack_1dc = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x24) >> 0x20);
    local_208 = (float)puVar1[5];
    fStack_204 = (float)((ulong)puVar1[5] >> 0x20);
    fStack_200 = (float)puVar1[6];
    fStack_1fc = (float)((ulong)puVar1[6] >> 0x20);
    fStack_370 = (float)local_510[1];
    local_228 = (float)puVar1[7];
    fStack_224 = (float)((ulong)puVar1[7] >> 0x20);
    fStack_220 = (float)puVar1[8];
    fStack_21c = (float)((ulong)puVar1[8] >> 0x20);
    local_248 = (float)*(undefined8 *)((long)puVar1 + 0x44);
    fStack_244 = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x44) >> 0x20);
    fStack_240 = (float)*(undefined8 *)((long)puVar1 + 0x4c);
    fStack_23c = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x4c) >> 0x20);
    fStack_37c = (float)((ulong)local_510[1] >> 0x20);
    local_268 = (float)*(undefined8 *)((long)puVar1 + 0x54);
    fStack_264 = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x54) >> 0x20);
    fStack_260 = (float)*(undefined8 *)((long)puVar1 + 0x5c);
    fStack_25c = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x5c) >> 0x20);
    local_288 = (float)puVar1[0xc];
    fStack_284 = (float)((ulong)puVar1[0xc] >> 0x20);
    fStack_280 = (float)puVar1[0xd];
    fStack_27c = (float)((ulong)puVar1[0xd] >> 0x20);
    local_398 = (float)local_510[2];
    local_2a8 = (float)puVar1[0xe];
    fStack_2a4 = (float)((ulong)puVar1[0xe] >> 0x20);
    fStack_2a0 = (float)puVar1[0xf];
    fStack_29c = (float)((ulong)puVar1[0xf] >> 0x20);
    local_2c8 = (float)*(undefined8 *)((long)puVar1 + 0x7c);
    fStack_2c4 = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x7c) >> 0x20);
    fStack_2c0 = (float)*(undefined8 *)((long)puVar1 + 0x84);
    fStack_2bc = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x84) >> 0x20);
    fStack_3a4 = (float)((ulong)local_510[2] >> 0x20);
    local_2e8 = (float)*(undefined8 *)((long)puVar1 + 0x8c);
    fStack_2e4 = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x8c) >> 0x20);
    fStack_2e0 = (float)*(undefined8 *)((long)puVar1 + 0x94);
    fStack_2dc = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x94) >> 0x20);
    local_308 = (float)puVar1[0x13];
    fStack_304 = (float)((ulong)puVar1[0x13] >> 0x20);
    fStack_300 = (float)puVar1[0x14];
    fStack_2fc = (float)((ulong)puVar1[0x14] >> 0x20);
    fStack_3b0 = (float)local_510[3];
    local_328 = (float)puVar1[0x15];
    fStack_324 = (float)((ulong)puVar1[0x15] >> 0x20);
    fStack_320 = (float)puVar1[0x16];
    fStack_31c = (float)((ulong)puVar1[0x16] >> 0x20);
    local_348 = (float)*(undefined8 *)((long)puVar1 + 0xb4);
    fStack_344 = (float)((ulong)*(undefined8 *)((long)puVar1 + 0xb4) >> 0x20);
    fStack_340 = (float)*(undefined8 *)((long)puVar1 + 0xbc);
    fStack_33c = (float)((ulong)*(undefined8 *)((long)puVar1 + 0xbc) >> 0x20);
    *(ulong *)((long)local_528 + 0xc) =
         CONCAT44(local_358 * fStack_1c4 + fStack_370 * fStack_244 + local_398 * fStack_2c4 +
                  fStack_3b0 * fStack_344 +
                  fStack_364 * fStack_204 + fStack_37c * fStack_284 + fStack_3a4 * fStack_304,
                  local_358 * local_1c8 + fStack_370 * local_248 + local_398 * local_2c8 +
                  fStack_3b0 * local_348 +
                  fStack_364 * local_208 + fStack_37c * local_288 + fStack_3a4 * local_308);
    *(ulong *)((long)local_528 + 0x14) =
         CONCAT44(local_358 * fStack_1bc + fStack_370 * fStack_23c + local_398 * fStack_2bc +
                  fStack_3b0 * fStack_33c +
                  fStack_364 * fStack_1fc + fStack_37c * fStack_27c + fStack_3a4 * fStack_2fc,
                  local_358 * fStack_1c0 + fStack_370 * fStack_240 + local_398 * fStack_2c0 +
                  fStack_3b0 * fStack_340 +
                  fStack_364 * fStack_200 + fStack_37c * fStack_280 + fStack_3a4 * fStack_300);
    *local_528 = CONCAT44(local_358 * fStack_1a4 + fStack_370 * fStack_224 + local_398 * fStack_2a4
                          + fStack_3b0 * fStack_324 +
                          fStack_364 * fStack_1e4 + fStack_37c * fStack_264 +
                          fStack_3a4 * fStack_2e4,
                          local_358 * local_1a8 + fStack_370 * local_228 + local_398 * local_2a8 +
                          fStack_3b0 * local_328 +
                          fStack_364 * local_1e8 + fStack_37c * local_268 + fStack_3a4 * local_2e8);
    local_528[1] = CONCAT44(local_358 * fStack_19c + fStack_370 * fStack_21c +
                            local_398 * fStack_29c + fStack_3b0 * fStack_31c +
                            fStack_364 * fStack_1dc + fStack_37c * fStack_25c +
                            fStack_3a4 * fStack_2dc,
                            local_358 * fStack_1a0 + fStack_370 * fStack_220 +
                            local_398 * fStack_2a0 + fStack_3b0 * fStack_320 +
                            fStack_364 * fStack_1e0 + fStack_37c * fStack_260 +
                            fStack_3a4 * fStack_2e0);
    local_510 = (undefined8 *)((long)local_510 + (long)in_R9D * 4);
    local_508 = local_508 + 2;
    local_528 = (undefined8 *)((long)local_528 + 0x1c);
  } while (local_528 < (undefined8 *)((long)in_RDI + (ulong)(uint)(in_ESI * 7) * 4));
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_7_coeffs)( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  stbir__3_coeff_setup();
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    float const * hc = horizontal_coefficients;

    stbir__4_coeff_start();
    stbir__3_coeff_remnant(4);
    stbir__store_output();
  } while ( output < output_end );
}